

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getDigits(char *zDate,char *zFormat,...)

{
  byte bVar1;
  byte bVar2;
  char in_AL;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 *puVar5;
  ulong uVar6;
  byte *pbVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 auStack_f8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  ulong local_48;
  undefined8 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_38 = (undefined1 *)auStack_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Da;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0x3000000010;
  puStack_40 = (undefined8 *)&stack0x00000008;
  iVar3 = 0;
  do {
    bVar1 = *zFormat;
    bVar2 = ((byte *)zFormat)[3];
    if (bVar1 == 0x30) {
      iVar4 = 0;
      pbVar7 = (byte *)zDate;
    }
    else {
      pbVar7 = (byte *)zDate + (ulong)(bVar1 - 0x31 & 0xff) + 1;
      lVar8 = 0;
      iVar4 = 0;
      do {
        if ((ulong)((byte *)zDate)[lVar8] - 0x3a < 0xfffffffffffffff6) goto LAB_001b6ec6;
        iVar4 = (int)(char)((byte *)zDate)[lVar8] + iVar4 * 10 + -0x30;
        lVar8 = lVar8 + 1;
      } while ((byte)(bVar1 - 0x30) != (char)lVar8);
    }
    if (((iVar4 < (char)(((byte *)zFormat)[1] - 0x30)) ||
        ((int)(uint)(ushort)yy_reduce_ofst[(long)(char)((byte *)zFormat)[2] + 0x14d] < iVar4)) ||
       ((bVar2 != 0 && (bVar2 != *pbVar7)))) break;
    uVar6 = local_48 & 0xffffffff;
    if (uVar6 < 0x29) {
      local_48 = CONCAT44(local_48._4_4_,(int)local_48 + 8);
      puVar5 = (undefined8 *)((long)auStack_f8 + uVar6);
    }
    else {
      puVar5 = puStack_40;
      puStack_40 = puStack_40 + 1;
    }
    zDate = (char *)(pbVar7 + 1);
    iVar3 = iVar3 + 1;
    zFormat = (char *)((byte *)zFormat + 4);
    *(int *)*puVar5 = iVar4;
  } while (bVar2 != 0);
LAB_001b6ec6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    auStack_f8[2] = in_RDX;
    auStack_f8[3] = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e      f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 14712 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}